

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assignment4Driver.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *this;
  undefined1 local_118 [8];
  Game game;
  char **argv_local;
  int argc_local;
  
  game._248_8_ = argv;
  Game::Game((Game *)local_118);
  Game::init_game_dependencies((Game *)local_118);
  Game::init_game_loop((Game *)local_118);
  this = std::operator<<((ostream *)&std::cout,"Game is over. Thanks for playing");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  Game::~Game((Game *)local_118);
  return 0;
}

Assistant:

int main(int argc, const char * argv[]) {
    Game game;
    // Choose all computers if you want to have tournament of comps playing against each other
    game.init_game_dependencies();
    game.init_game_loop();
    cout << "Game is over. Thanks for playing" << endl;
    return 0;
}